

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcFragDepthTests.cpp
# Opt level: O2

IterateResult __thiscall deqp::FragDepthCompareCase::iterate(FragDepthCompareCase *this)

{
  RenderContext *pRVar1;
  code *pcVar2;
  FragDepthCompareCase *pFVar3;
  bool bVar4;
  int iVar5;
  deUint32 dVar6;
  undefined4 uVar7;
  undefined4 extraout_var;
  int *piVar9;
  NotSupportedError *this_00;
  TestError *pTVar10;
  int iVar11;
  char *description;
  long lVar12;
  int y;
  int x;
  int iVar13;
  int iVar14;
  float fVar15;
  allocator<char> local_346;
  allocator<char> local_345;
  float local_344;
  FragDepthCompareCase *local_340;
  float local_338;
  allocator<char> local_332;
  allocator<char> local_331;
  undefined1 local_330 [32];
  TestLog *local_310;
  Surface referenceFrame;
  string local_2e8;
  float constDepthCoord [16];
  string local_288;
  float varyingDepthCoord [16];
  Surface renderedFrame;
  string local_208;
  ShaderProgram basicQuadProgram;
  VertexArrayBinding posBinding;
  VertexArrayBinding local_c8;
  Random rnd;
  long lVar8;
  undefined4 extraout_var_00;
  
  local_310 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar5);
  dVar6 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  deRandom_init(&rnd.m_rnd,dVar6);
  local_340 = this;
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[4])();
  piVar9 = (int *)CONCAT44(extraout_var_00,iVar5);
  iVar5 = *piVar9;
  iVar13 = 0x80;
  if (iVar5 < 0x80) {
    iVar13 = iVar5;
  }
  iVar11 = 0x80;
  if (piVar9[1] < 0x80) {
    iVar11 = piVar9[1];
  }
  local_344 = (float)de::Random::getInt((Random *)&rnd.m_rnd,0,iVar5 - iVar13);
  local_338 = (float)de::Random::getInt((Random *)&rnd.m_rnd,0,piVar9[1] - iVar11);
  tcu::Surface::Surface(&renderedFrame,iVar13,iVar11);
  tcu::Surface::Surface(&referenceFrame,iVar13,iVar11);
  if (piVar9[6] == 0) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Depth buffer is required",glcts::fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcFragDepthTests.cpp"
               ,0x9b);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  (**(code **)(lVar8 + 0x1a00))(local_344,local_338,iVar13,iVar11);
  (**(code **)(lVar8 + 0x188))(0x4500);
  (**(code **)(lVar8 + 0x5e0))(0xb71);
  pFVar3 = local_340;
  pRVar1 = ((local_340->super_TestCase).m_context)->m_renderCtx;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_330,
             "${VERSION_DECL}\nin highp vec4 a_position;\nin highp vec2 a_coord;\nout highp vec2 v_coord;\nvoid main (void)\n{\n   gl_Position = a_position;\n   v_coord = a_coord;\n}\n"
             ,&local_345);
  specializeVersion((string *)varyingDepthCoord,(string *)local_330,pFVar3->m_glslVersion);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)constDepthCoord,(char *)varyingDepthCoord._0_8_,&local_346);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_208,
             "${VERSION_DECL}\nuniform highp vec4 u_color;\nlayout(location = 0) out mediump vec4 o_color;\nvoid main (void)\n{\n   o_color = u_color;\n}\n"
             ,&local_331);
  specializeVersion(&local_288,&local_208,pFVar3->m_glslVersion);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2e8,local_288._M_dataplus._M_p,&local_332);
  glu::makeVtxFragSources((ProgramSources *)&posBinding,(string *)constDepthCoord,&local_2e8);
  glu::ShaderProgram::ShaderProgram(&basicQuadProgram,pRVar1,(ProgramSources *)&posBinding);
  glu::ProgramSources::~ProgramSources((ProgramSources *)&posBinding);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)constDepthCoord);
  std::__cxx11::string::~string((string *)varyingDepthCoord);
  std::__cxx11::string::~string((string *)local_330);
  if (basicQuadProgram.m_program.m_info.linkOk == false) {
    glu::operator<<(local_310,&basicQuadProgram);
    pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar10,"Compile failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcFragDepthTests.cpp"
               ,0xad);
    __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  constDepthCoord[0xc] = 0.0;
  constDepthCoord[0xd] = 1.0;
  constDepthCoord[0xe] = 0.1;
  constDepthCoord[0xf] = 1.0;
  constDepthCoord[8] = 0.0;
  constDepthCoord[9] = -1.0;
  constDepthCoord[10] = 0.1;
  constDepthCoord[0xb] = 1.0;
  constDepthCoord[4] = -1.0;
  constDepthCoord[5] = 1.0;
  constDepthCoord[6] = 0.1;
  constDepthCoord[7] = 1.0;
  constDepthCoord[0] = -1.0;
  constDepthCoord[1] = -1.0;
  constDepthCoord[2] = 0.1;
  constDepthCoord[3] = 1.0;
  varyingDepthCoord[0xc] = 1.0;
  varyingDepthCoord[0xd] = 1.0;
  varyingDepthCoord[0xe] = -1.0;
  varyingDepthCoord[0xf] = 1.0;
  varyingDepthCoord[8] = 1.0;
  varyingDepthCoord[9] = -1.0;
  varyingDepthCoord[10] = 0.0;
  varyingDepthCoord[0xb] = 1.0;
  varyingDepthCoord[4] = 0.0;
  varyingDepthCoord[5] = 1.0;
  varyingDepthCoord[6] = 0.0;
  varyingDepthCoord[7] = 1.0;
  varyingDepthCoord[0] = 0.0;
  varyingDepthCoord[1] = -1.0;
  varyingDepthCoord[2] = 1.0;
  varyingDepthCoord[3] = 1.0;
  (**(code **)(lVar8 + 0x1680))(basicQuadProgram.m_program.m_program);
  pcVar2 = *(code **)(lVar8 + 0x15a0);
  uVar7 = (**(code **)(lVar8 + 0xb48))(basicQuadProgram.m_program.m_program,"u_color");
  (*pcVar2)(0,0,0x3f800000,0x3f800000,uVar7);
  (**(code **)(lVar8 + 0x4a0))(0x207);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_330,"a_position",(allocator<char> *)&local_2e8);
  glu::va::Float(&posBinding,(string *)local_330,4,4,0,constDepthCoord);
  pFVar3 = local_340;
  std::__cxx11::string::~string((string *)local_330);
  local_330._0_8_ = (pointer)0x600000000;
  local_330._8_4_ = INDEXTYPE_UINT16;
  local_330._16_8_ = iterate::quadIndices;
  glu::draw(((pFVar3->super_TestCase).m_context)->m_renderCtx,basicQuadProgram.m_program.m_program,1
            ,&posBinding,(PrimitiveList *)local_330,(DrawUtilCallback *)0x0);
  std::__cxx11::string::~string((string *)&posBinding.binding.name);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_330,"a_position",(allocator<char> *)&local_2e8);
  glu::va::Float(&posBinding,(string *)local_330,4,4,0,varyingDepthCoord);
  std::__cxx11::string::~string((string *)local_330);
  local_330._0_8_ = (pointer)0x600000000;
  local_330._8_4_ = INDEXTYPE_UINT16;
  local_330._16_8_ = iterate::quadIndices;
  glu::draw(((local_340->super_TestCase).m_context)->m_renderCtx,
            basicQuadProgram.m_program.m_program,1,&posBinding,(PrimitiveList *)local_330,
            (DrawUtilCallback *)0x0);
  std::__cxx11::string::~string((string *)&posBinding.binding.name);
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"Draw base quads",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcFragDepthTests.cpp"
                  ,0xc5);
  glu::ShaderProgram::~ShaderProgram(&basicQuadProgram);
  pFVar3 = local_340;
  pRVar1 = ((local_340->super_TestCase).m_context)->m_renderCtx;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_330,
             "${VERSION_DECL}\nin highp vec4 a_position;\nin highp vec2 a_coord;\nout highp vec2 v_coord;\nvoid main (void)\n{\n   gl_Position = a_position;\n   v_coord = a_coord;\n}\n"
             ,(allocator<char> *)&local_208);
  specializeVersion((string *)varyingDepthCoord,(string *)local_330,pFVar3->m_glslVersion);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)constDepthCoord,(char *)varyingDepthCoord._0_8_,&local_345);
  specializeVersion(&local_288,&local_340->m_fragSrc,local_340->m_glslVersion);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2e8,local_288._M_dataplus._M_p,&local_346);
  glu::makeVtxFragSources((ProgramSources *)&posBinding,(string *)constDepthCoord,&local_2e8);
  glu::ShaderProgram::ShaderProgram(&basicQuadProgram,pRVar1,(ProgramSources *)&posBinding);
  glu::ProgramSources::~ProgramSources((ProgramSources *)&posBinding);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::~string((string *)constDepthCoord);
  std::__cxx11::string::~string((string *)varyingDepthCoord);
  std::__cxx11::string::~string((string *)local_330);
  glu::operator<<(local_310,&basicQuadProgram);
  if (basicQuadProgram.m_program.m_info.linkOk == false) {
    pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar10,"Compile failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcFragDepthTests.cpp"
               ,0xd0);
    __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  varyingDepthCoord[4] = 1.0;
  varyingDepthCoord[5] = 0.0;
  varyingDepthCoord[6] = 1.0;
  varyingDepthCoord[7] = 1.0;
  varyingDepthCoord[0] = 0.0;
  varyingDepthCoord[1] = 0.0;
  varyingDepthCoord[2] = 0.0;
  varyingDepthCoord[3] = 1.0;
  constDepthCoord[0xc] = 1.0;
  constDepthCoord[0xd] = 1.0;
  constDepthCoord[0xe] = -1.0;
  constDepthCoord[0xf] = 1.0;
  constDepthCoord[8] = 1.0;
  constDepthCoord[9] = -1.0;
  constDepthCoord[10] = 0.0;
  constDepthCoord[0xb] = 1.0;
  constDepthCoord[4] = -1.0;
  constDepthCoord[5] = 1.0;
  constDepthCoord[6] = 0.0;
  constDepthCoord[7] = 1.0;
  constDepthCoord[0] = -1.0;
  constDepthCoord[1] = -1.0;
  constDepthCoord[2] = 1.0;
  constDepthCoord[3] = 1.0;
  (**(code **)(lVar8 + 0x1680))(basicQuadProgram.m_program.m_program);
  (**(code **)(lVar8 + 0x4a0))(local_340->m_compareFunc);
  pcVar2 = *(code **)(lVar8 + 0x15a0);
  uVar7 = (**(code **)(lVar8 + 0xb48))(basicQuadProgram.m_program.m_program,"u_color");
  (*pcVar2)(0,0x3f800000,0,0x3f800000,uVar7);
  setupDefaultUniforms
            (((local_340->super_TestCase).m_context)->m_renderCtx,
             basicQuadProgram.m_program.m_program);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_330,"a_position",(allocator<char> *)&local_288);
  glu::va::Float(&posBinding,(string *)local_330,4,4,0,constDepthCoord);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2e8,"a_coord",(allocator<char> *)&local_208);
  glu::va::Float(&local_c8,&local_2e8,2,4,0,varyingDepthCoord);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::~string((string *)local_330);
  local_330._0_8_ = (pointer)0x600000000;
  local_330._8_4_ = INDEXTYPE_UINT16;
  local_330._16_8_ = iterate::quadIndices;
  glu::draw(((local_340->super_TestCase).m_context)->m_renderCtx,
            basicQuadProgram.m_program.m_program,2,&posBinding,(PrimitiveList *)local_330,
            (DrawUtilCallback *)0x0);
  lVar12 = 0x58;
  do {
    std::__cxx11::string::~string((string *)((long)&posBinding.binding.type + lVar12));
    lVar12 = lVar12 + -0x50;
  } while (lVar12 != -0x48);
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"Draw test quad",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcFragDepthTests.cpp"
                  ,0xe4);
  glu::ShaderProgram::~ShaderProgram(&basicQuadProgram);
  pRVar1 = ((local_340->super_TestCase).m_context)->m_renderCtx;
  tcu::Surface::getAccess((PixelBufferAccess *)&basicQuadProgram,&renderedFrame);
  glu::readPixels(pRVar1,(int)local_344,(int)local_338,(PixelBufferAccess *)&basicQuadProgram);
  for (iVar5 = 0; iVar5 < referenceFrame.m_height; iVar5 = iVar5 + 1) {
    iVar11 = (int)((float)referenceFrame.m_width * 0.5 + 0.5);
    local_344 = ((float)iVar5 + 0.5) / (float)referenceFrame.m_height;
    iVar13 = referenceFrame.m_width;
    if (iVar11 < referenceFrame.m_width) {
      iVar13 = iVar11;
    }
    iVar14 = 0;
    if (iVar11 < 0) {
      iVar13 = 0;
    }
    iVar11 = 0;
    if (0 < iVar13) {
      iVar11 = iVar13;
    }
    for (; pFVar3 = local_340, iVar11 != iVar14; iVar14 = iVar14 + 1) {
      basicQuadProgram.m_shaders[0].
      super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = ((float)iVar14 + 0.5) / (float)referenceFrame.m_width
      ;
      basicQuadProgram.m_shaders[0].
      super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
      super__Vector_impl_data._M_start._4_4_ = local_344;
      fVar15 = (*local_340->m_evalFunc)((Vec2 *)&basicQuadProgram);
      bVar4 = compare<float>(pFVar3->m_compareFunc,fVar15,0.55);
      uVar7 = 0xffff0000;
      if (bVar4) {
        uVar7 = 0xff00ff00;
      }
      *(undefined4 *)
       ((long)referenceFrame.m_pixels.m_ptr + (long)(referenceFrame.m_width * iVar5 + iVar14) * 4) =
           uVar7;
    }
    for (iVar11 = iVar13; iVar14 = referenceFrame.m_width, pFVar3 = local_340,
        iVar11 < referenceFrame.m_width; iVar11 = iVar11 + 1) {
      local_338 = (float)iVar11;
      basicQuadProgram.m_shaders[0].
      super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = (local_338 + 0.5) / (float)referenceFrame.m_width;
      basicQuadProgram.m_shaders[0].
      super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
      super__Vector_impl_data._M_start._4_4_ = local_344;
      fVar15 = (*local_340->m_evalFunc)((Vec2 *)&basicQuadProgram);
      bVar4 = compare<float>(pFVar3->m_compareFunc,fVar15,
                             1.0 - (((local_338 - (float)iVar13) + 0.5) / (float)(iVar14 - iVar13) +
                                   local_344) * 0.5);
      uVar7 = 0xffff0000;
      if (bVar4) {
        uVar7 = 0xff00ff00;
      }
      *(undefined4 *)
       ((long)referenceFrame.m_pixels.m_ptr + (long)(referenceFrame.m_width * iVar5 + iVar11) * 4) =
           uVar7;
    }
  }
  bVar4 = tcu::fuzzyCompare(local_310,"Result","Image comparison result",&referenceFrame,
                            &renderedFrame,0.05,COMPARE_LOG_RESULT);
  description = "Fail";
  if (bVar4) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((local_340->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar4,
             description);
  tcu::Surface::~Surface(&referenceFrame);
  tcu::Surface::~Surface(&renderedFrame);
  return STOP;
}

Assistant:

FragDepthCompareCase::IterateResult FragDepthCompareCase::iterate(void)
{
	TestLog&				 log = m_testCtx.getLog();
	const glw::Functions&	gl  = m_context.getRenderContext().getFunctions();
	de::Random				 rnd(deStringHash(getName()));
	const tcu::RenderTarget& renderTarget = m_context.getRenderContext().getRenderTarget();
	int						 viewportW	= de::min(128, renderTarget.getWidth());
	int						 viewportH	= de::min(128, renderTarget.getHeight());
	int						 viewportX	= rnd.getInt(0, renderTarget.getWidth() - viewportW);
	int						 viewportY	= rnd.getInt(0, renderTarget.getHeight() - viewportH);
	tcu::Surface			 renderedFrame(viewportW, viewportH);
	tcu::Surface			 referenceFrame(viewportW, viewportH);
	const float				 constDepth = 0.1f;

	if (renderTarget.getDepthBits() == 0)
		throw tcu::NotSupportedError("Depth buffer is required", "", __FILE__, __LINE__);

	gl.viewport(viewportX, viewportY, viewportW, viewportH);
	gl.clear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT | GL_STENCIL_BUFFER_BIT);
	gl.enable(GL_DEPTH_TEST);

	static const deUint16 quadIndices[] = { 0, 1, 2, 2, 1, 3 };

	// Fill viewport with 2 quads - one with constant depth and another with d = [-1..1]
	{
		glu::ShaderProgram basicQuadProgram(
			m_context.getRenderContext(),
			glu::makeVtxFragSources(specializeVersion(s_vertexShaderSrc, m_glslVersion).c_str(),
									specializeVersion(s_defaultFragmentShaderSrc, m_glslVersion).c_str()));

		if (!basicQuadProgram.isOk())
		{
			log << basicQuadProgram;
			TCU_FAIL("Compile failed");
		}

		const float constDepthCoord[] = { -1.0f, -1.0f, constDepth, 1.0f, -1.0f, +1.0f, constDepth, 1.0f,
										  0.0f,  -1.0f, constDepth, 1.0f, 0.0f,  +1.0f, constDepth, 1.0f };
		const float varyingDepthCoord[] = { 0.0f,  -1.0f, +1.0f, 1.0f, 0.0f,  +1.0f, 0.0f,  1.0f,
											+1.0f, -1.0f, 0.0f,  1.0f, +1.0f, +1.0f, -1.0f, 1.0f };

		gl.useProgram(basicQuadProgram.getProgram());
		gl.uniform4f(gl.getUniformLocation(basicQuadProgram.getProgram(), "u_color"), 0.0f, 0.0f, 1.0f, 1.0f);
		gl.depthFunc(GL_ALWAYS);

		{
			glu::VertexArrayBinding posBinding = glu::va::Float("a_position", 4, 4, 0, &constDepthCoord[0]);
			glu::draw(m_context.getRenderContext(), basicQuadProgram.getProgram(), 1, &posBinding,
					  glu::pr::Triangles(DE_LENGTH_OF_ARRAY(quadIndices), &quadIndices[0]));
		}

		{
			glu::VertexArrayBinding posBinding = glu::va::Float("a_position", 4, 4, 0, &varyingDepthCoord[0]);
			glu::draw(m_context.getRenderContext(), basicQuadProgram.getProgram(), 1, &posBinding,
					  glu::pr::Triangles(DE_LENGTH_OF_ARRAY(quadIndices), &quadIndices[0]));
		}

		GLU_EXPECT_NO_ERROR(gl.getError(), "Draw base quads");
	}

	// Render with depth test.
	{
		glu::ShaderProgram program(m_context.getRenderContext(),
								   glu::makeVtxFragSources(specializeVersion(s_vertexShaderSrc, m_glslVersion).c_str(),
														   specializeVersion(m_fragSrc, m_glslVersion).c_str()));
		log << program;

		if (!program.isOk())
			TCU_FAIL("Compile failed");

		const float coord[]	= { 0.0f, 0.0f, 0.0f, 1.0f, 1.0f, 0.0f, 1.0f, 1.0f };
		const float position[] = { -1.0f, -1.0f, +1.0f, 1.0f, -1.0f, +1.0f, 0.0f,  1.0f,
								   +1.0f, -1.0f, 0.0f,  1.0f, +1.0f, +1.0f, -1.0f, 1.0f };

		gl.useProgram(program.getProgram());
		gl.depthFunc(m_compareFunc);
		gl.uniform4f(gl.getUniformLocation(program.getProgram(), "u_color"), 0.0f, 1.0f, 0.0f, 1.0f);

		// Setup default helper uniforms.
		setupDefaultUniforms(m_context.getRenderContext(), program.getProgram());

		{
			glu::VertexArrayBinding vertexArrays[] = { glu::va::Float("a_position", 4, 4, 0, &position[0]),
													   glu::va::Float("a_coord", 2, 4, 0, &coord[0]) };
			glu::draw(m_context.getRenderContext(), program.getProgram(), DE_LENGTH_OF_ARRAY(vertexArrays),
					  &vertexArrays[0], glu::pr::Triangles(DE_LENGTH_OF_ARRAY(quadIndices), &quadIndices[0]));
		}

		GLU_EXPECT_NO_ERROR(gl.getError(), "Draw test quad");
	}

	glu::readPixels(m_context.getRenderContext(), viewportX, viewportY, renderedFrame.getAccess());

	// Render reference.
	for (int y = 0; y < referenceFrame.getHeight(); y++)
	{
		float yf   = ((float)y + 0.5f) / (float)referenceFrame.getHeight();
		int   half = de::clamp((int)((float)referenceFrame.getWidth() * 0.5f + 0.5f), 0, referenceFrame.getWidth());

		// Fill left half - comparison to constant 0.5
		for (int x = 0; x < half; x++)
		{
			float xf	= ((float)x + 0.5f) / (float)referenceFrame.getWidth();
			float d		= m_evalFunc(Vec2(xf, yf));
			bool  dpass = compare(m_compareFunc, d, constDepth * 0.5f + 0.5f);

			referenceFrame.setPixel(x, y, dpass ? tcu::RGBA::green() : tcu::RGBA::blue());
		}

		// Fill right half - comparison to interpolated depth
		for (int x = half; x < referenceFrame.getWidth(); x++)
		{
			float xf	= ((float)x + 0.5f) / (float)referenceFrame.getWidth();
			float xh	= ((float)x - (float)half + 0.5f) / (float)(referenceFrame.getWidth() - half);
			float rd	= 1.0f - (xh + yf) * 0.5f;
			float d		= m_evalFunc(Vec2(xf, yf));
			bool  dpass = compare(m_compareFunc, d, rd);

			referenceFrame.setPixel(x, y, dpass ? tcu::RGBA::green() : tcu::RGBA::blue());
		}
	}

	bool isOk = tcu::fuzzyCompare(log, "Result", "Image comparison result", referenceFrame, renderedFrame, 0.05f,
								  tcu::COMPARE_LOG_RESULT);
	m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL, isOk ? "Pass" : "Fail");
	return STOP;
}